

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

int __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::size(SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
       *this)

{
  bool bVar1;
  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
  *in_RDI;
  Iterator it;
  int res;
  Iterator IStack_18;
  int local_c;
  
  local_c = 0;
  Iterator::Iterator(&IStack_18,in_RDI);
  while( true ) {
    bVar1 = Iterator::hasNext(&IStack_18);
    if (!bVar1) break;
    Iterator::next(&IStack_18);
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int size() const
  {
    int res=0;
    Iterator it(*this);
    while(it.hasNext()) {
      it.next();
      res++;
    }
    return res;
  }